

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O3

int AF_FString_Replace(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  FString *this;
  char *pcVar1;
  FString s2;
  FString s1;
  FString FStack_38;
  FString local_30;
  FString local_28;
  FString local_20;
  
  if (numparam < 1) {
    pcVar1 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      if (numparam == 1) {
        pcVar1 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x02') {
          this = (FString *)(param->field_0).field_1.a;
          FString::AttachToOther(&local_20,(FString *)(param + 1));
          if ((uint)numparam < 3) {
            pcVar1 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x02') {
              FString::AttachToOther(&local_28,(FString *)(param + 2));
              FString::FString(&local_30,*local_20.Chars);
              FString::FString(&FStack_38,*local_28.Chars);
              FString::Substitute(this,&local_30,&FStack_38);
              FString::~FString(&FStack_38);
              FString::~FString(&local_30);
              FString::~FString(&local_28);
              FString::~FString(&local_20);
              return 0;
            }
            pcVar1 = "param[paramnum].Type == REGT_STRING";
          }
          __assert_fail(pcVar1,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                        ,0x354,
                        "int AF_FString_Replace(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar1 = "param[paramnum].Type == REGT_STRING";
      }
      __assert_fail(pcVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                    ,0x353,
                    "int AF_FString_Replace(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar1 = "param[paramnum].Type == REGT_POINTER";
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                ,0x352,"int AF_FString_Replace(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(FString, Replace)
{
	PARAM_SELF_STRUCT_PROLOGUE(FString);
	PARAM_STRING(s1);
	PARAM_STRING(s2);
	self->Substitute(*s1, *s2);
	return 0;
}